

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bloaty.cc
# Opt level: O2

void __thiscall bloaty::NameMunger::AddRegex(NameMunger *this,string *regex,string *replacement)

{
  __single_object reg;
  undefined1 auStack_48 [48];
  
  std::make_unique<bloaty::ReImpl,std::__cxx11::string_const&>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)auStack_48);
  std::
  pair<std::unique_ptr<bloaty::ReImpl,_std::default_delete<bloaty::ReImpl>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<std::unique_ptr<bloaty::ReImpl,_std::default_delete<bloaty::ReImpl>_>,_true>
            ((pair<std::unique_ptr<bloaty::ReImpl,_std::default_delete<bloaty::ReImpl>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)(auStack_48 + 8),
             (unique_ptr<bloaty::ReImpl,_std::default_delete<bloaty::ReImpl>_> *)auStack_48,
             replacement);
  std::
  vector<std::pair<std::unique_ptr<bloaty::ReImpl,std::default_delete<bloaty::ReImpl>>,std::__cxx11::string>,std::allocator<std::pair<std::unique_ptr<bloaty::ReImpl,std::default_delete<bloaty::ReImpl>>,std::__cxx11::string>>>
  ::
  emplace_back<std::pair<std::unique_ptr<bloaty::ReImpl,std::default_delete<bloaty::ReImpl>>,std::__cxx11::string>>
            ((vector<std::pair<std::unique_ptr<bloaty::ReImpl,std::default_delete<bloaty::ReImpl>>,std::__cxx11::string>,std::allocator<std::pair<std::unique_ptr<bloaty::ReImpl,std::default_delete<bloaty::ReImpl>>,std::__cxx11::string>>>
              *)this,(pair<std::unique_ptr<bloaty::ReImpl,_std::default_delete<bloaty::ReImpl>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)(auStack_48 + 8));
  std::
  pair<std::unique_ptr<bloaty::ReImpl,_std::default_delete<bloaty::ReImpl>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~pair((pair<std::unique_ptr<bloaty::ReImpl,_std::default_delete<bloaty::ReImpl>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)(auStack_48 + 8));
  std::unique_ptr<bloaty::ReImpl,_std::default_delete<bloaty::ReImpl>_>::~unique_ptr
            ((unique_ptr<bloaty::ReImpl,_std::default_delete<bloaty::ReImpl>_> *)auStack_48);
  return;
}

Assistant:

void NameMunger::AddRegex(const std::string& regex,
                          const std::string& replacement) {
  auto reg = absl::make_unique<ReImpl>(regex);
  regexes_.push_back(std::make_pair(std::move(reg), replacement));
}